

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::New
          (ArenaAllocator *alloc,int increment)

{
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  
  pLVar1 = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
           new<Memory::ArenaAllocator>(0x30,alloc,0x35916e);
  (pLVar1->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc = alloc;
  (pLVar1->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_01378b88;
  pLVar1->increment = increment;
  (pLVar1->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer = (Type)0x0;
  (pLVar1->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  pLVar1->length = 0;
  return pLVar1;
}

Assistant:

static List * New(TAllocator * alloc, int increment = DefaultIncrement)
        {
            return AllocatorNew(TAllocator, alloc, List, alloc, increment);
        }